

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFactorySystem.cpp
# Opt level: O1

void __thiscall
ObjectFactorySystem::CompleteConstructorSwap
          (ObjectFactorySystem *this,ProtectedObjectSwapper *swapper)

{
  IObjectConstructor *pIVar1;
  long lVar2;
  IObject *pObject;
  ulong uVar3;
  pointer ppIVar4;
  long *plVar5;
  _Rb_tree_node_base *p_Var6;
  undefined8 *puVar7;
  char *pcVar8;
  ICompilerLogger *pIVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (((swapper->super_RuntimeProtector).m_bHashadException != true) ||
     (swapper->m_ProtectedPhase == PHASE_DELETEOLD)) {
    pIVar9 = this->m_pLogger;
    if (pIVar9 != (ICompilerLogger *)0x0) {
      (**(code **)(*(long *)pIVar9 + 0x10))(pIVar9,"Object swap completed\n");
    }
    if ((((swapper->super_RuntimeProtector).m_bHashadException == true) &&
        (swapper->m_ProtectedPhase == PHASE_DELETEOLD)) &&
       (pIVar9 = this->m_pLogger, pIVar9 != (ICompilerLogger *)0x0)) {
      (*(code *)**(undefined8 **)pIVar9)
                (pIVar9,"Exception during object destruction of old objects, leaking.\n");
    }
    goto LAB_00113440;
  }
  pIVar9 = this->m_pLogger;
  if (pIVar9 == (ICompilerLogger *)0x0) goto switchD_001132e3_default;
  (*(code *)**(undefined8 **)pIVar9)
            (pIVar9,"Exception during object swapping, switching back to previous objects.\n");
  switch(swapper->m_ProtectedPhase) {
  case PHASE_NONE:
    goto switchD_001132e3_default;
  case PHASE_SERIALIZEOUT:
    pIVar9 = this->m_pLogger;
    puVar7 = *(undefined8 **)pIVar9;
    pcVar8 = "\tError occured during serialize out old objects phase.\n";
    break;
  case PHASE_CONSTRUCTNEW:
    pIVar9 = this->m_pLogger;
    puVar7 = *(undefined8 **)pIVar9;
    pcVar8 = "\tError occured during constructing new objects phase.\n";
    break;
  case PHASE_SERIALIZEIN:
    pIVar9 = this->m_pLogger;
    puVar7 = *(undefined8 **)pIVar9;
    pcVar8 = "\tError occured during serialize into the new objects phase.\n";
    break;
  case PHASE_AUTOCONSTRUCTSINGLETONS:
    pIVar9 = this->m_pLogger;
    puVar7 = *(undefined8 **)pIVar9;
    pcVar8 = "\tError occured during auto construct singletons phase.\n";
    break;
  case PHASE_INITANDSERIALIZEOUTTEST:
    if (this->m_bTestSerialization == true) {
      pcVar8 = "\tError occured during Initialization and serialize test of new objects phase.\n";
    }
    else {
      pcVar8 = "\tError occured during Initialization phase.\n";
    }
    (*(code *)**(undefined8 **)this->m_pLogger)(this->m_pLogger,pcVar8);
  default:
    goto switchD_001132e3_default;
  }
  (*(code *)*puVar7)(pIVar9,pcVar8);
switchD_001132e3_default:
  std::vector<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>::operator=
            (&this->m_Constructors,&swapper->m_ConstructorsOld);
  if (swapper->m_ProtectedPhase != PHASE_SERIALIZEOUT) {
    (swapper->m_Serializer).m_bLoading = true;
    (swapper->m_Serializer).m_pCurrentObject = (IObject *)0x0;
    ppIVar4 = (this->m_Constructors).
              super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_Constructors).
        super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar4) {
      uVar11 = 0;
      do {
        pIVar1 = ppIVar4[uVar11];
        lVar2 = (**(code **)(*(long *)pIVar1 + 0x60))(pIVar1);
        if (lVar2 != 0) {
          uVar10 = 0;
          do {
            pObject = (IObject *)(**(code **)(*(long *)pIVar1 + 0x58))(pIVar1,uVar10);
            if (pObject != (IObject *)0x0) {
              SimpleSerializer::Serialize(&swapper->m_Serializer,pObject);
            }
            uVar10 = uVar10 + 1;
            uVar3 = (**(code **)(*(long *)pIVar1 + 0x60))(pIVar1);
          } while (uVar10 < uVar3);
        }
        uVar11 = uVar11 + 1;
        ppIVar4 = (this->m_Constructors).
                  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(this->m_Constructors).
                                      super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4 >>
                               3));
    }
    ppIVar4 = (this->m_Constructors).
              super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->m_Constructors).
        super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppIVar4) {
      uVar11 = 0;
      do {
        pIVar1 = ppIVar4[uVar11];
        lVar2 = (**(code **)(*(long *)pIVar1 + 0x60))(pIVar1);
        if (lVar2 != 0) {
          uVar10 = 0;
          do {
            plVar5 = (long *)(**(code **)(*(long *)pIVar1 + 0x58))(pIVar1,uVar10);
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 0x18))(plVar5,0);
            }
            uVar10 = uVar10 + 1;
            uVar3 = (**(code **)(*(long *)pIVar1 + 0x60))(pIVar1);
          } while (uVar10 < uVar3);
        }
        uVar11 = uVar11 + 1;
        ppIVar4 = (this->m_Constructors).
                  super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar11 < (ulong)((long)(this->m_Constructors).
                                      super__Vector_base<IObjectConstructor_*,_std::allocator<IObjectConstructor_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar4 >>
                               3));
    }
  }
LAB_00113440:
  for (p_Var6 = *(_Rb_tree_node_base **)&this->field_0x68;
      p_Var6 != (_Rb_tree_node_base *)&this->field_0x58;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    (**(code **)**(undefined8 **)(p_Var6 + 1))();
  }
  return;
}

Assistant:

void ObjectFactorySystem::CompleteConstructorSwap( ProtectedObjectSwapper& swapper )
{
	if( swapper.HasHadException() && PHASE_DELETEOLD != swapper.m_ProtectedPhase )
	{
		if( m_pLogger )
		{
			m_pLogger->LogError( "Exception during object swapping, switching back to previous objects.\n" );
			switch( swapper.m_ProtectedPhase  )
			{
            case PHASE_NONE:
                AU_ASSERT( false );
                break;
			case PHASE_SERIALIZEOUT:
				m_pLogger->LogError( "\tError occured during serialize out old objects phase.\n" );
				break;
			case PHASE_CONSTRUCTNEW:
				m_pLogger->LogError( "\tError occured during constructing new objects phase.\n" );
				break;
			case PHASE_SERIALIZEIN:
				m_pLogger->LogError( "\tError occured during serialize into the new objects phase.\n" );
				break;
			case PHASE_AUTOCONSTRUCTSINGLETONS:
				m_pLogger->LogError( "\tError occured during auto construct singletons phase.\n" );
                break;
			case PHASE_INITANDSERIALIZEOUTTEST:
                if( m_bTestSerialization )
                {
				    m_pLogger->LogError( "\tError occured during Initialization and serialize test of new objects phase.\n" );
                }
                else
                {
				    m_pLogger->LogError( "\tError occured during Initialization phase.\n" );
                }
                break;
           case PHASE_DELETEOLD:
                break;
 			}
		}

		//swap back to new constructors before everything is serialized back in
		m_Constructors = swapper.m_ConstructorsOld;
		if( PHASE_SERIALIZEOUT != swapper.m_ProtectedPhase )
		{
			//serialize back with old objects - could cause exception which isn't handled, but hopefully not.
			swapper.m_Serializer.SetIsLoading( true );
			for( size_t i = 0; i < m_Constructors.size(); ++i )
			{
				IObjectConstructor* pConstructor = m_Constructors[i];
				for( PerTypeObjectId objId = 0; objId < pConstructor->GetNumberConstructedObjects(); ++ objId )
				{
					// Iserialize new object
					IObject* pObject = pConstructor->GetConstructedObject( objId );
					if (pObject)
					{
						swapper.m_Serializer.Serialize( pObject );
					}			
				}
			}

			// Do a second pass, initializing objects now that they've all been serialized
			for( size_t i = 0; i < m_Constructors.size(); ++i )
			{
				IObjectConstructor* pConstructor = m_Constructors[i];
				for( PerTypeObjectId objId = 0; objId < pConstructor->GetNumberConstructedObjects(); ++ objId )
				{
					IObject* pObject = pConstructor->GetConstructedObject( objId );
					if (pObject)
					{
						pObject->Init(false);
					}			
				}
			}
		}
	}
	else
	{
		if( m_pLogger ) m_pLogger->LogInfo( "Object swap completed\n");
		if( swapper.HasHadException() && PHASE_DELETEOLD == swapper.m_ProtectedPhase )
		{
			if( m_pLogger ) m_pLogger->LogError( "Exception during object destruction of old objects, leaking.\n" );
		}
	}

	// Notify any listeners that constructors have changed
	TObjectFactoryListeners::iterator it = m_Listeners.begin();
	TObjectFactoryListeners::iterator itEnd = m_Listeners.end();
	while (it != itEnd)
	{
		(*it)->OnConstructorsAdded();
		++it;
	}
}